

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveRight(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *x,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *b)

{
  pointer pnVar1;
  pointer vec;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  
  (*this->solveTime->_vptr_Timer[3])();
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&this->vec,b);
  vec = (x->val).
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pnVar1 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (vec != pnVar1) {
    do {
      (vec->m_backend).fpclass = cpp_dec_float_finite;
      (vec->m_backend).prec_elem = 0x1c;
      (vec->m_backend).data._M_elems[0] = 0;
      (vec->m_backend).data._M_elems[1] = 0;
      (vec->m_backend).data._M_elems[2] = 0;
      (vec->m_backend).data._M_elems[3] = 0;
      (vec->m_backend).data._M_elems[4] = 0;
      (vec->m_backend).data._M_elems[5] = 0;
      (vec->m_backend).data._M_elems[6] = 0;
      (vec->m_backend).data._M_elems[7] = 0;
      (vec->m_backend).data._M_elems[8] = 0;
      (vec->m_backend).data._M_elems[9] = 0;
      (vec->m_backend).data._M_elems[10] = 0;
      (vec->m_backend).data._M_elems[0xb] = 0;
      (vec->m_backend).data._M_elems[0xc] = 0;
      (vec->m_backend).data._M_elems[0xd] = 0;
      (vec->m_backend).data._M_elems[0xe] = 0;
      (vec->m_backend).data._M_elems[0xf] = 0;
      (vec->m_backend).data._M_elems[0x10] = 0;
      (vec->m_backend).data._M_elems[0x11] = 0;
      (vec->m_backend).data._M_elems[0x12] = 0;
      (vec->m_backend).data._M_elems[0x13] = 0;
      (vec->m_backend).data._M_elems[0x14] = 0;
      (vec->m_backend).data._M_elems[0x15] = 0;
      (vec->m_backend).data._M_elems[0x16] = 0;
      (vec->m_backend).data._M_elems[0x17] = 0;
      (vec->m_backend).data._M_elems[0x18] = 0;
      (vec->m_backend).data._M_elems[0x19] = 0;
      (vec->m_backend).data._M_elems[0x1a] = 0;
      (vec->m_backend).data._M_elems[0x1b] = 0;
      *(undefined8 *)((long)(vec->m_backend).data._M_elems + 0x6d) = 0;
      vec = vec + 1;
    } while (vec != pnVar1);
    vec = (x->val).
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  }
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solveRight(&this->
                super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,vec,(this->vec).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->solveCount = this->solveCount + 1;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveRight(VectorBase<R>& x, const VectorBase<R>& b) //const
{

   this->solveTime->start();

   this->vec = b;
   x.clear();
   CLUFactor<R>::solveRight(x.get_ptr(), vec.get_ptr());

   solveCount++;
   solveTime->stop();
}